

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_linux.cpp
# Opt level: O3

FUNCTION_RETURN
getDiskInfos_dev(vector<DiskInfo,_std::allocator<DiskInfo>_> *disk_infos,
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *disk_by_uuid)

{
  iterator __position;
  bool bVar1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  int *piVar4;
  ssize_t sVar5;
  long lVar6;
  size_t sVar7;
  long *plVar8;
  int *piVar9;
  long *plVar10;
  uint out_size;
  char *uuid;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 uVar12;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  string label_dir;
  string cur_dir;
  string base_dir;
  vector<DiskInfo,_std::allocator<DiskInfo>_> *__range5;
  string device_name_s;
  stat sym_stat;
  DiskInfo tmpDiskInfo;
  char device_name [1024];
  DIR *local_aa0;
  uint *local_a90;
  long *local_a88;
  undefined8 local_a80;
  undefined4 uStack_a78;
  undefined4 uStack_a74;
  int local_a70;
  char *local_a68 [2];
  char local_a58 [16];
  long *local_a48;
  long local_a40;
  long local_a38;
  long lStack_a30;
  uint *local_a28;
  undefined8 local_a20;
  uint local_a18;
  undefined4 uStack_a14;
  undefined4 uStack_a10;
  undefined4 uStack_a0c;
  vector<DiskInfo,_std::allocator<DiskInfo>_> *local_a08;
  char *local_a00 [2];
  char local_9f0 [16];
  long local_9e0;
  stat local_9d8;
  anon_struct_1296_7_5326303c local_948;
  char local_438 [1032];
  
  __dirp = opendir("/dev/disk/by-uuid");
  local_a08 = disk_infos;
  if (__dirp == (DIR *)0x0) {
    piVar4 = __errno_location();
    strerror(*piVar4);
    _log((double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
  }
  else {
    local_a48 = &local_a38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a48,"/dev/disk/by-uuid/","");
LAB_00132656:
    while( true ) {
      pdVar3 = readdir(__dirp);
      if ((pdVar3 == (dirent *)0x0) ||
         (0x27 < (ulong)((*(long *)(disk_infos + 8) - *(long *)disk_infos >> 4) * 0x2c3f35ba781948b1
                        ))) break;
      if (pdVar3->d_name[0] == 'u') goto LAB_001326b7;
      if ((pdVar3->d_name[0] != '.') ||
         ((pdVar3->d_name[1] != '\0' && ((pdVar3->d_name[1] != '.' || (pdVar3->d_name[2] != '\0'))))
         )) goto LAB_001326c7;
    }
    closedir(__dirp);
    if (local_a48 != &local_a38) {
      operator_delete(local_a48);
    }
  }
  local_9e0 = *(long *)disk_infos;
  lVar6 = *(long *)(disk_infos + 8);
  local_a90 = (uint *)&local_a80;
  local_a48 = (long *)0x12;
  local_a90 = (uint *)std::__cxx11::string::_M_create((ulong *)&local_a90,(ulong)&local_a48);
  local_a80 = local_a48;
  *(undefined8 *)local_a90 = 0x7369642f7665642f;
  *(undefined8 *)(local_a90 + 2) = 0x62616c2d79622f6b;
  *(undefined2 *)(local_a90 + 4) = 0x6c65;
  local_a88 = local_a48;
  *(char *)((long)local_a90 + (long)local_a48) = '\0';
  local_aa0 = opendir((char *)local_a90);
  if (local_aa0 == (DIR *)0x0) {
    std::__cxx11::string::_M_replace((ulong)&local_a90,0,(char *)local_a88,0x1a3de3);
    local_aa0 = opendir((char *)local_a90);
    if (local_aa0 == (DIR *)0x0) {
      piVar4 = __errno_location();
      strerror(*piVar4);
      _log((double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
      goto LAB_00132cee;
    }
  }
  while (pdVar3 = readdir(local_aa0), pdVar3 != (dirent *)0x0) {
    if ((pdVar3->d_name[0] != '.') ||
       ((pdVar3->d_name[1] != '\0' && ((pdVar3->d_name[1] != '.' || (pdVar3->d_name[2] != '\0'))))))
    {
      local_a68[0] = local_a58;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a68,local_a90,(char *)((long)local_a88 + (long)local_a90));
      std::__cxx11::string::append((char *)local_a68);
      plVar8 = (long *)std::__cxx11::string::append((char *)local_a68);
      plVar10 = plVar8 + 2;
      if ((long *)*plVar8 == plVar10) {
        local_a38 = *plVar10;
        lStack_a30 = plVar8[3];
        local_a48 = &local_a38;
      }
      else {
        local_a38 = *plVar10;
        local_a48 = (long *)*plVar8;
      }
      local_a40 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if (local_a68[0] != local_a58) {
        operator_delete(local_a68[0]);
      }
      iVar2 = stat((char *)local_a48,(stat *)&local_948);
      if (iVar2 == 0) {
        for (piVar4 = *(int **)local_a08; piVar4 != *(int **)(local_a08 + 8);
            piVar4 = piVar4 + 0x144) {
          if (*piVar4 == local_948.device._4_4_) {
            license::mstrlcpy((char *)((long)piVar4 + 0x40d),pdVar3->d_name,0xff);
            *(undefined1 *)(piVar4 + 0x143) = 1;
            _log((double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06));
            break;
          }
        }
      }
      else {
        piVar4 = __errno_location();
        strerror(*piVar4);
        _log((double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
      }
      if (local_a48 != &local_a38) {
        operator_delete(local_a48);
      }
    }
  }
  closedir(local_aa0);
LAB_00132cee:
  if (local_a90 != (uint *)&local_a80) {
    operator_delete(local_a90);
  }
  return (FUNCTION_RETURN)(lVar6 == local_9e0);
LAB_001326b7:
  if ((pdVar3->d_name[1] != 's') || (pdVar3->d_name[2] != 'b')) {
LAB_001326c7:
    local_a68[0] = local_a58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a68,local_a48,local_a40 + (long)local_a48);
    uuid = pdVar3->d_name;
    std::__cxx11::string::append((char *)local_a68);
    iVar2 = stat(local_a68[0],&local_9d8);
    if (iVar2 == 0) {
      local_948.id = (int)local_9d8.st_ino;
      sVar5 = readlink(local_a68[0],local_438,0x3ff);
      if (sVar5 == -1) {
        piVar4 = __errno_location();
        strerror(*piVar4);
        _log((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      }
      else {
        local_438[sVar5] = '\0';
        local_a00[0] = local_9f0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a00,local_438,local_438 + sVar5);
        lVar6 = std::__cxx11::string::find_last_of((char *)local_a00,0x1a4035,0xffffffffffffffff);
        if (lVar6 != -1) {
          std::__cxx11::string::substr((ulong)&local_a90,(ulong)local_a00);
          std::__cxx11::string::operator=((string *)local_a00,(string *)&local_a90);
          if (local_a90 != (uint *)&local_a80) {
            operator_delete(local_a90);
          }
        }
        license::mstrlcpy(local_948.device,local_a00[0],0x400);
        parseUUID(uuid,local_948.disk_sn,out_size);
        local_948.sn_initialized = true;
        local_948.label_initialized = false;
        local_948.preferred = false;
        piVar4 = *(int **)disk_infos;
        if (piVar4 == *(int **)(disk_infos + 8)) {
          bVar1 = true;
        }
        else {
          do {
            piVar9 = piVar4 + 0x144;
            bVar1 = local_948.id != *piVar4;
            if (local_948.id == *piVar4) break;
            piVar4 = piVar9;
          } while (piVar9 != *(int **)(disk_infos + 8));
        }
        local_a28 = &local_a18;
        sVar7 = strlen(uuid);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a28,uuid,uuid + sVar7);
        local_a90 = (uint *)&local_a80;
        if (local_a28 == &local_a18) {
          uStack_a78 = uStack_a10;
          uStack_a74 = uStack_a0c;
        }
        else {
          local_a90 = local_a28;
        }
        local_a80 = (long *)CONCAT44(uStack_a14,local_a18);
        local_a88 = (long *)local_a20;
        local_a20 = 0;
        local_a18 = local_a18 & 0xffffff00;
        local_a70 = local_948.id;
        local_a28 = &local_a18;
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<std::__cxx11::string,int>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)disk_by_uuid,(string *)&local_a90);
        uVar11 = extraout_XMM0_Da_01;
        uVar12 = extraout_XMM0_Db_01;
        if (local_a90 != (uint *)&local_a80) {
          operator_delete(local_a90);
          uVar11 = extraout_XMM0_Da_02;
          uVar12 = extraout_XMM0_Db_02;
        }
        if (local_a28 != &local_a18) {
          operator_delete(local_a28);
          uVar11 = extraout_XMM0_Da_03;
          uVar12 = extraout_XMM0_Db_03;
        }
        disk_infos = local_a08;
        if (bVar1) {
          _log((double)CONCAT44(uVar12,uVar11));
          __position._M_current = *(anon_struct_1296_7_5326303c **)(disk_infos + 8);
          if (__position._M_current == *(anon_struct_1296_7_5326303c **)(disk_infos + 0x10)) {
            std::vector<DiskInfo,std::allocator<DiskInfo>>::_M_realloc_insert<DiskInfo_const&>
                      ((vector<DiskInfo,std::allocator<DiskInfo>> *)disk_infos,__position,&local_948
                      );
          }
          else {
            memcpy(__position._M_current,&local_948,0x510);
            *(long *)(disk_infos + 8) = *(long *)(disk_infos + 8) + 0x510;
          }
        }
        if (local_a00[0] != local_9f0) {
          operator_delete(local_a00[0]);
        }
      }
    }
    else {
      piVar4 = __errno_location();
      strerror(*piVar4);
      _log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    }
    if (local_a68[0] != local_a58) {
      operator_delete(local_a68[0]);
    }
  }
  goto LAB_00132656;
}

Assistant:

FUNCTION_RETURN getDiskInfos_dev(std::vector<DiskInfo> &disk_infos,
								 std::unordered_map<std::string, int> &disk_by_uuid) {
	struct dirent *dir = NULL;
	struct stat sym_stat;
	FUNCTION_RETURN result;
	char device_name[MAX_PATH];

	DIR *disk_by_uuid_dir = opendir(ID_FOLDER);
	if (disk_by_uuid_dir == nullptr) {
		LOG_DEBUG("Open " ID_FOLDER " fail: %s", std::strerror(errno));
	} else {
		const std::string base_dir(ID_FOLDER "/");
		while ((dir = readdir(disk_by_uuid_dir)) != nullptr && disk_infos.size() < MAX_UNITS) {
			if (::strcmp(dir->d_name, ".") == 0 || ::strcmp(dir->d_name, "..") == 0 ||
				::strncmp(dir->d_name, "usb", 3) == 0) {
				continue;
			}

			std::string cur_dir = base_dir + dir->d_name;
			if (stat(cur_dir.c_str(), &sym_stat) == 0) {
				DiskInfo tmpDiskInfo;
				tmpDiskInfo.id = sym_stat.st_ino;
				ssize_t len = ::readlink(cur_dir.c_str(), device_name, MAX_PATH - 1);
				if (len != -1) {
					device_name[len] = '\0';
					std::string device_name_s(device_name, len);
					auto pos = device_name_s.find_last_of("/");
					if (pos != std::string::npos) {
						device_name_s = device_name_s.substr(pos + 1);
					}
					mstrlcpy(tmpDiskInfo.device, device_name_s.c_str(), sizeof(tmpDiskInfo.device));
					PARSE_ID_FUNC(dir->d_name, tmpDiskInfo.disk_sn, sizeof(tmpDiskInfo.disk_sn));
					tmpDiskInfo.sn_initialized = true;
					tmpDiskInfo.label_initialized = false;
					tmpDiskInfo.preferred = false;
					bool found = false;
					for (auto diskInfo : disk_infos) {
						if (tmpDiskInfo.id == diskInfo.id) {
							found = true;
							break;
						}
					}
					disk_by_uuid.insert(std::pair<std::string, int>(std::string(dir->d_name), tmpDiskInfo.id));
					if (!found) {
						LOG_DEBUG("Found disk inode %d device %s, sn %s", sym_stat.st_ino, tmpDiskInfo.device,
								  dir->d_name);
						disk_infos.push_back(tmpDiskInfo);
					}
				} else {
					LOG_DEBUG("Error %s during readlink of %s", std::strerror(errno), cur_dir.c_str());
				}
			} else {
				LOG_DEBUG("Error %s during stat of %s", std::strerror(errno), cur_dir.c_str());
			}
		}
		closedir(disk_by_uuid_dir);
	}

	result = disk_infos.size() > 0 ? FUNCTION_RETURN::FUNC_RET_OK : FUNCTION_RETURN::FUNC_RET_NOT_AVAIL;
	read_disk_labels(disk_infos);
	return result;
}